

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint64_t local_38;
  uint64_t ptime64;
  uint32_t ptime;
  pthread_t thr;
  uint wanttime;
  int c;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _wanttime = argv;
  argv_local._0_4_ = argc;
  iVar1 = nva_init();
  if (iVar1 == 0) {
    thr._0_4_ = 0;
    while (thr._4_4_ = getopt((int)argv_local,_wanttime,"tc:m:"), thr._4_4_ != -1) {
      if (thr._4_4_ == 99) {
        __isoc99_sscanf(_optarg,"%d",&cnum);
      }
      else if (thr._4_4_ == 0x6d) {
        __isoc99_sscanf(_optarg,"%x",&mask);
      }
      else if ((thr._4_4_ == 0x74) && (thr._0_4_ = (uint)thr + 1, 2 < (uint)thr)) {
        thr._0_4_ = 2;
      }
    }
    if (cnum < nva_cardsnum) {
      if (_optind < (int)argv_local) {
        __isoc99_sscanf(_wanttime[_optind],"%x",&a);
        if ((uint)thr == 0) {
          pthread_create((pthread_t *)&stack0xffffffffffffffd8,(pthread_attr_t *)0x0,watchfun,
                         (void *)0x0);
        }
        else if ((uint)thr == 1) {
          pthread_create((pthread_t *)&stack0xffffffffffffffd8,(pthread_attr_t *)0x0,twatchfun,
                         (void *)0x0);
        }
        else {
          pthread_create((pthread_t *)&stack0xffffffffffffffd8,(pthread_attr_t *)0x0,t64watchfun,
                         (void *)0x0);
        }
        ptime64._4_4_ = 0;
        local_38 = 0;
        do {
          while (get == put) {
            sched_yield();
          }
          if ((uint)thr == 0) {
            printf("%08x\n",(ulong)queue[get]);
          }
          else if ((uint)thr == 1) {
            printf("%08x[+%d]: %08x\n",(ulong)tqueue[get],(ulong)(tqueue[get] - ptime64._4_4_),
                   (ulong)queue[get]);
            ptime64._4_4_ = tqueue[get];
          }
          else {
            printf("%016lu[+%lu]: %08x\n",tqueue64[get],tqueue64[get] - local_38,(ulong)queue[get]);
            local_38 = tqueue64[get];
          }
          get = (get + 1) % 0x100000;
        } while( true );
      }
      fprintf(_stderr,"No address specified.\n");
    }
    else if (nva_cardsnum == 0) {
      fprintf(_stderr,"No cards found.\n");
    }
    else {
      fprintf(_stderr,"No such card.\n");
    }
  }
  else {
    fprintf(_stderr,"PCI init failure!\n");
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	unsigned int wanttime = 0;
	while ((c = getopt (argc, argv, "tc:m:")) != -1)
		switch (c) {
			case 't':
				wanttime++;
				if (wanttime > 2)
					wanttime = 2;
				break;
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'm':
				sscanf(optarg, "%x", &mask);
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}
	if (optind >= argc) {
		fprintf (stderr, "No address specified.\n");
		return 1;
	}
	sscanf (argv[optind], "%x", &a);

	pthread_t thr;
	if (wanttime == 0)
		pthread_create(&thr, 0, watchfun, 0);
	else if (wanttime == 1)
		pthread_create(&thr, 0, twatchfun, 0);
	else
		pthread_create(&thr, 0, t64watchfun, 0);

	uint32_t ptime = 0;
	uint64_t ptime64 = 0;
	while (1) {
		while (get == put)
			sched_yield();

		if (wanttime == 0)
			printf("%08x\n", queue[get]);
		else if (wanttime == 1) {
			printf("%08x[+%d]: %08x\n", tqueue[get], tqueue[get]-ptime, queue[get]);
			ptime = tqueue[get];
		} else {
			printf("%016"PRIu64"[+%"PRIu64"]: %08x\n", tqueue64[get], tqueue64[get]-ptime64, queue[get]);
			ptime64 = tqueue64[get];
		}

		get = (get + 1) % SZ;
	}
}